

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O3

char * UniqueObjectHelper<char*>(int index)

{
  ushort uVar1;
  size_type sVar2;
  const_reference ppcVar3;
  size_type_conflict i;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  char buffer [64];
  char *local_70;
  char local_68 [72];
  
  sVar2 = g_unique_charstar_objects.settings.table_size;
  do {
    uVar5 = sVar2;
    sVar2 = uVar5 * 2;
  } while ((int)uVar5 <= index);
  if (g_unique_charstar_objects.settings.table_size < uVar5) {
    google::sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
    resize(&g_unique_charstar_objects,uVar5);
  }
  uVar6 = (ulong)(long)index / 0x30;
  uVar5 = (ulong)(long)index % 0x30;
  uVar4 = (uint)uVar5;
  i = (size_type_conflict)uVar5;
  if ((g_unique_charstar_objects.groups.
       super__Vector_base<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>,_google::libc_allocator_with_realloc<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar6].bitmap[uVar4 >> 3] >> (uVar4 & 7) & 1) == 0)
  {
    snprintf(local_68,0x40,"%d",index);
    local_70 = strdup(local_68);
    uVar1 = g_unique_charstar_objects.groups.
            super__Vector_base<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>,_google::libc_allocator_with_realloc<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar6].settings.num_buckets;
    google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
    set(g_unique_charstar_objects.groups.
        super__Vector_base<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>,_google::libc_allocator_with_realloc<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + uVar6,i,&local_70);
    g_unique_charstar_objects.settings.num_buckets =
         g_unique_charstar_objects.settings.num_buckets +
         ((ulong)g_unique_charstar_objects.groups.
                 super__Vector_base<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>,_google::libc_allocator_with_realloc<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].settings.num_buckets -
         (ulong)uVar1);
  }
  ppcVar3 = google::
            sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
            get(g_unique_charstar_objects.groups.
                super__Vector_base<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>,_google::libc_allocator_with_realloc<google::sparsegroup<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar6,i);
  return *ppcVar3;
}

Assistant:

char* UniqueObjectHelper(int index) {
  // First grow the table if need be.
  sparsetable<char*>::size_type table_size = g_unique_charstar_objects.size();
  while (index >= static_cast<int>(table_size)) {
    assert(table_size * 2 > table_size);  // avoid overflow problems
    table_size *= 2;
  }
  if (table_size > g_unique_charstar_objects.size())
    g_unique_charstar_objects.resize(table_size);

  if (!g_unique_charstar_objects.test(index)) {
    char buffer[64];
    snprintf(buffer, sizeof(buffer), "%d", index);
    g_unique_charstar_objects[index] = strdup(buffer);
  }
  return g_unique_charstar_objects.get(index);
}